

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_5a3f28::HandleInMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,const_iterator kwInIter,cmMakefile *makefile)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  bool bVar1;
  pointer pcVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var3;
  const_iterator end;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  string_view sVar7;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_2e8;
  string local_2e0;
  string local_2c0;
  cmAlphaNum local_2a0;
  cmAlphaNum local_270;
  string local_240;
  cmAlphaNum local_220;
  cmAlphaNum local_1f0;
  string local_1c0;
  string_view local_1a0;
  string *local_190;
  string *value;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  undefined4 local_e8;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_98;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_88;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  size_type sStack_78;
  Doing doing;
  size_type varsCount;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  cmMakefile *local_40;
  unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
  local_38;
  __single_object fb;
  cmMakefile *makefile_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  const_iterator kwInIter_local;
  
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)kwInIter._M_current;
  fb._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::cmForEachFunctionBlocker_*,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
  .super__Head_base<0UL,_(anonymous_namespace)::cmForEachFunctionBlocker_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>,_true,_true>
        )std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&args_local,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&fb);
  if (!bVar1) {
    __assert_fail("\"A valid iterator expected\" && kwInIter != args.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmForEachCommand.cxx"
                  ,0x11f,
                  "bool (anonymous namespace)::HandleInMode(const std::vector<std::string> &, std::vector<std::string>::const_iterator, cmMakefile &)"
                 );
  }
  local_40 = makefile;
  std::make_unique<(anonymous_namespace)::cmForEachFunctionBlocker,cmMakefile*>
            ((cmMakefile **)&local_38);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_local;
  pcVar2 = std::
           unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
           ::operator->(&local_38);
  local_58 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::
                back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (&pcVar2->Args);
  varsCount = (size_type)
              std::
              copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        (local_48,local_50,
                         (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )local_58);
  pcVar2 = std::
           unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
           ::operator->(&local_38);
  sStack_78 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pcVar2->Args);
  pcVar2 = std::
           unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
           ::operator->(&local_38);
  cmForEachFunctionBlocker::SetIterationVarsCount(pcVar2,sStack_78);
  __range1._4_4_ = 0;
  p_Var3 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&args_local);
  begin._M_current = p_Var3->_M_current;
  end = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(args);
  local_98 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (begin,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )end._M_current);
  local_88 = &local_98;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_88);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar1 = std::operator==(local_c0,"LISTS");
    if (bVar1) {
      if (__range1._4_4_ == 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"ZIP_LISTS can not be used with LISTS or ITEMS",&local_e1);
        cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        goto LAB_00402b64;
      }
      if (sStack_78 != 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"ITEMS or LISTS require exactly one iteration variable",
                   &local_109);
        cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        goto LAB_00402b64;
      }
      __range1._4_4_ = 1;
    }
    else {
      bVar1 = std::operator==(local_c0,"ITEMS");
      if (bVar1) {
        if (__range1._4_4_ == 3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"ZIP_LISTS can not be used with LISTS or ITEMS",&local_131
                    );
          cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator(&local_131);
          goto LAB_00402b64;
        }
        if (sStack_78 != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,"ITEMS or LISTS require exactly one iteration variable",
                     &local_159);
          cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
          goto LAB_00402b64;
        }
        __range1._4_4_ = 2;
      }
      else {
        bVar1 = std::operator==(local_c0,"ZIP_LISTS");
        if (bVar1) {
          if (__range1._4_4_ != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_180,"ZIP_LISTS can not be used with LISTS or ITEMS",
                       (allocator<char> *)((long)&value + 7));
            cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
            goto LAB_00402b64;
          }
          __range1._4_4_ = 3;
          pcVar2 = std::
                   unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                   ::operator->(&local_38);
          cmForEachFunctionBlocker::SetZipLists(pcVar2);
        }
        else if (__range1._4_4_ == 1) {
          local_190 = cmMakefile::GetSafeDefinition(makefile,local_c0);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            sVar7 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_190);
            local_1a0 = sVar7;
            pcVar2 = std::
                     unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                     ::operator->(&local_38);
            cmExpandList(local_1a0,&pcVar2->Args,true);
          }
        }
        else {
          if ((__range1._4_4_ != 2) && (__range1._4_4_ != 3)) {
            cmAlphaNum::cmAlphaNum(&local_1f0,"Unknown argument:\n");
            cmAlphaNum::cmAlphaNum(&local_220,"  ");
            cmStrCat<std::__cxx11::string,char[2]>
                      (&local_1c0,&local_1f0,&local_220,local_c0,(char (*) [2])0xc47774);
            cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
            goto LAB_00402b64;
          }
          pcVar2 = std::
                   unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
                   ::operator->(&local_38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pcVar2->Args,local_c0);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if ((__range1._4_4_ == 3) && (1 < sStack_78)) {
    sVar5 = sStack_78 << 1;
    pcVar2 = std::
             unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
             ::operator->(&local_38);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&pcVar2->Args);
    if (sVar5 != sVar6) {
      cmAlphaNum::cmAlphaNum(&local_270,"Expected ");
      std::__cxx11::to_string(&local_2c0,sStack_78);
      cmAlphaNum::cmAlphaNum(&local_2a0,&local_2c0);
      pcVar2 = std::
               unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
               ::operator->(&local_38);
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pcVar2->Args);
      std::__cxx11::to_string(&local_2e0,sVar5 - sStack_78);
      cmStrCat<char[28],std::__cxx11::string>
                (&local_240,&local_270,&local_2a0,(char (*) [28])" list variables, but given ",
                 &local_2e0);
      cmMakefile::IssueMessage(makefile,FATAL_ERROR,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2c0);
      goto LAB_00402b64;
    }
  }
  std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>::
  unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>,void>
            ((unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>> *)&local_2e8,
             &local_38);
  cmMakefile::AddFunctionBlocker(makefile,&local_2e8);
  std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
            (&local_2e8);
LAB_00402b64:
  kwInIter_local._M_current._7_1_ = 1;
  local_e8 = 1;
  std::
  unique_ptr<(anonymous_namespace)::cmForEachFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmForEachFunctionBlocker>_>
  ::~unique_ptr(&local_38);
  return (bool)(kwInIter_local._M_current._7_1_ & 1);
}

Assistant:

bool HandleInMode(std::vector<std::string> const& args,
                  std::vector<std::string>::const_iterator kwInIter,
                  cmMakefile& makefile)
{
  assert("A valid iterator expected" && kwInIter != args.end());

  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&makefile);

  // Copy iteration variable names first
  std::copy(args.begin(), kwInIter, std::back_inserter(fb->Args));
  // Remember the count of given iteration variable names
  const auto varsCount = fb->Args.size();
  fb->SetIterationVarsCount(varsCount);

  enum Doing
  {
    DoingNone,
    DoingLists,
    DoingItems,
    DoingZipLists
  };
  Doing doing = DoingNone;
  // Iterate over arguments past the "IN" keyword
  for (std::string const& arg : cmMakeRange(++kwInIter, args.end())) {
    if (arg == "LISTS") {
      if (doing == DoingZipLists) {
        makefile.IssueMessage(MessageType::FATAL_ERROR,
                              "ZIP_LISTS can not be used with LISTS or ITEMS");
        return true;
      }
      if (varsCount != 1u) {
        makefile.IssueMessage(
          MessageType::FATAL_ERROR,
          "ITEMS or LISTS require exactly one iteration variable");
        return true;
      }
      doing = DoingLists;

    } else if (arg == "ITEMS") {
      if (doing == DoingZipLists) {
        makefile.IssueMessage(MessageType::FATAL_ERROR,
                              "ZIP_LISTS can not be used with LISTS or ITEMS");
        return true;
      }
      if (varsCount != 1u) {
        makefile.IssueMessage(
          MessageType::FATAL_ERROR,
          "ITEMS or LISTS require exactly one iteration variable");
        return true;
      }
      doing = DoingItems;

    } else if (arg == "ZIP_LISTS") {
      if (doing != DoingNone) {
        makefile.IssueMessage(MessageType::FATAL_ERROR,
                              "ZIP_LISTS can not be used with LISTS or ITEMS");
        return true;
      }
      doing = DoingZipLists;
      fb->SetZipLists();

    } else if (doing == DoingLists) {
      auto const& value = makefile.GetSafeDefinition(arg);
      if (!value.empty()) {
        cmExpandList(value, fb->Args, true);
      }

    } else if (doing == DoingItems || doing == DoingZipLists) {
      fb->Args.push_back(arg);

    } else {
      makefile.IssueMessage(MessageType::FATAL_ERROR,
                            cmStrCat("Unknown argument:\n", "  ", arg, "\n"));
      return true;
    }
  }

  // If `ZIP_LISTS` given and variables count more than 1,
  // make sure the given lists count matches variables...
  if (doing == DoingZipLists && varsCount > 1u &&
      (2u * varsCount) != fb->Args.size()) {
    makefile.IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Expected ", std::to_string(varsCount),
               " list variables, but given ",
               std::to_string(fb->Args.size() - varsCount)));
    return true;
  }

  makefile.AddFunctionBlocker(std::move(fb));

  return true;
}